

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

ssize_t __thiscall
HttpHeaderBase::send(HttpHeaderBase *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  IReaderWriter *writer_local;
  HttpHeaderBase *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    buildHeader(this);
  }
  uVar3 = std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::size();
  sVar4 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x18))
                    ((long *)CONCAT44(in_register_00000034,__fd),uVar3,uVar1);
  return sVar4;
}

Assistant:

int HttpHeaderBase::send(IReaderWriter *writer) const
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (mHeaderStr.empty())
	{
		buildHeader();
	}
	
	LOG("Writing header of length %d", mHeaderStr.size());
	
	return writer->write(mHeaderStr.c_str(), mHeaderStr.size());
}